

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::reset(XMLDateTime *this)

{
  int local_14;
  int i;
  XMLDateTime *this_local;
  
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    this->fValue[local_14] = 0;
  }
  this->fMilliSecond = 0.0;
  this->fHasTime = false;
  this->fTimeZone[1] = 0;
  this->fTimeZone[0] = 0;
  this->fEnd = 0;
  this->fStart = 0;
  if (this->fBuffer != (XMLCh *)0x0) {
    *this->fBuffer = L'\0';
  }
  return;
}

Assistant:

inline void XMLDateTime::reset()
{
    for ( int i=0; i < TOTAL_SIZE; i++ )
        fValue[i] = 0;

    fMilliSecond   = 0;
    fHasTime      = false;
    fTimeZone[hh] = fTimeZone[mm] = 0;
    fStart = fEnd = 0;

    if (fBuffer)
        *fBuffer = 0;
}